

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialHexaANCF.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChMaterialHexaANCF::Calc_D
          (ChMaterialHexaANCF *this,ChVector<double> *E,ChVector<double> *nu,ChVector<double> *G)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  dVar1 = nu->m_data[2];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar1;
  auVar4 = *(undefined1 (*) [16])nu->m_data;
  dVar2 = E->m_data[1];
  dVar3 = E->m_data[2];
  auVar5 = *(undefined1 (*) [16])E->m_data;
  dVar17 = nu->m_data[1];
  auVar15._8_8_ = dVar17;
  auVar15._0_8_ = dVar17;
  auVar6 = vshufpd_avx(auVar5,auVar5,1);
  auVar14._0_8_ = -dVar1;
  auVar14._8_8_ = 0x8000000000000000;
  auVar11._0_8_ = -dVar17;
  auVar11._8_8_ = -dVar17;
  auVar10._0_8_ = dVar1 * dVar3;
  auVar10._8_8_ = auVar4._8_8_ * dVar3;
  auVar14 = vunpcklpd_avx(auVar14,auVar8);
  auVar11 = vunpcklpd_avx(auVar15,auVar11);
  auVar22._0_8_ = (dVar2 * auVar4._0_8_) / auVar5._0_8_;
  auVar22._8_8_ = 0;
  auVar6 = vdivpd_avx(auVar10,auVar6);
  auVar23._8_8_ = 0x3ff0000000000000;
  auVar23._0_8_ = 0x3ff0000000000000;
  auVar12 = vunpcklpd_avx(auVar23,auVar22);
  auVar8 = vunpcklpd_avx(auVar8,auVar22);
  auVar8 = vfmadd213pd_fma(auVar8,auVar4,*(undefined1 (*) [16])(nu->m_data + 1));
  auVar12 = vfmadd231pd_fma(auVar12,auVar6,auVar14);
  auVar14 = vshufpd_avx(auVar6,auVar6,1);
  auVar10 = vfmadd213sd_fma(auVar6,auVar22,auVar14);
  auVar7 = vfnmadd213sd_fma(auVar22,auVar4,auVar12);
  auVar7 = vfnmadd231sd_fma(auVar7,auVar15,auVar14);
  auVar9._0_8_ = auVar8._0_8_ * dVar3;
  auVar9._8_8_ = auVar8._8_8_ * dVar3;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar1 * auVar4._0_8_;
  auVar7 = vfnmadd231sd_fma(auVar7,auVar14,auVar18);
  auVar8 = vfmadd213sd_fma(auVar14,auVar4,auVar6);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = auVar6._0_8_ * auVar22._0_8_;
  auVar14 = vfnmadd213sd_fma(auVar19,auVar15,auVar7);
  auVar7._8_8_ = E->m_data[0];
  auVar7._0_8_ = E->m_data[0];
  auVar7 = vmulpd_avx512vl(auVar12,auVar7);
  dVar17 = auVar14._0_8_;
  auVar24._8_8_ = dVar17;
  auVar24._0_8_ = dVar17;
  auVar21._0_8_ = (auVar10._0_8_ * auVar5._0_8_) / dVar17;
  auVar5 = vdivpd_avx(auVar9,auVar24);
  auVar10 = ZEXT816(0);
  auVar12 = vfnmadd213sd_fma(auVar22,auVar4,ZEXT816(0x3ff0000000000000));
  auVar14 = vdivpd_avx(auVar7,auVar24);
  auVar21._8_8_ = auVar21._0_8_;
  auVar21._16_8_ = auVar21._0_8_;
  auVar21._24_8_ = auVar21._0_8_;
  auVar21 = vblendpd_avx(ZEXT1632(auVar14),auVar21,4);
  auVar4 = vunpcklpd_avx(auVar4,ZEXT816(0x3ff0000000000000));
  auVar4 = vfmadd231pd_fma(auVar4,auVar6,auVar11);
  auVar21 = vblendpd_avx(auVar21,ZEXT1632(auVar10),8);
  auVar16._0_8_ = (auVar12._0_8_ * dVar3) / dVar17;
  auVar6 = vmovhpd_avx(ZEXT816(0) << 0x40,G->m_data[2]);
  auVar14 = vmovhpd_avx(ZEXT816(0) << 0x40,G->m_data[0]);
  auVar12._0_8_ = dVar2 * auVar4._0_8_;
  auVar12._8_8_ = dVar2 * auVar4._8_8_;
  dVar1 = G->m_data[1];
  *(undefined1 (*) [32])
   (this->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array =
       auVar21;
  auVar4 = vdivpd_avx(auVar12,auVar24);
  auVar20._16_16_ = auVar14;
  auVar20._0_16_ = auVar10;
  auVar16._8_8_ = auVar16._0_8_;
  auVar16._16_8_ = auVar16._0_8_;
  auVar16._24_8_ = auVar16._0_8_;
  auVar21 = vblendpd_avx(ZEXT1632(auVar5),auVar16,4);
  auVar21 = vblendpd_avx(auVar21,ZEXT1632(auVar10),8);
  auVar13._16_16_ = auVar4;
  auVar13._0_16_ = auVar10;
  *(undefined1 (*) [32])
   ((this->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
   + 4) = auVar13;
  (this->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[8]
       = (dVar2 * auVar8._0_8_) / dVar17;
  (this->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[9]
       = 0.0;
  (this->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [10] = 0.0;
  (this->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0xb] = 0.0;
  *(undefined1 (*) [32])
   ((this->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
   + 0xc) = auVar21;
  *(undefined1 (*) [32])
   ((this->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
   + 0x10) = ZEXT1632(auVar10);
  *(undefined1 (*) [32])
   ((this->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
   + 0x14) = ZEXT1632(auVar6);
  *(undefined1 (*) [32])
   ((this->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
   + 0x18) = ZEXT1632(auVar10);
  (this->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1c] = dVar1;
  (this->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1d] = 0.0;
  (this->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1e] = 0.0;
  (this->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1f] = 0.0;
  *(undefined1 (*) [32])
   ((this->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
   + 0x20) = auVar20;
  return;
}

Assistant:

void ChMaterialHexaANCF::Calc_D(const ChVector<>& E, const ChVector<>& nu, const ChVector<>& G) {
    // orthotropic material ref: http://homes.civil.aau.dk/lda/Continuum/material.pdf
    // except position of the shear terms is different to match the original ANCF reference paper

    double nu_12 = nu.x();
    double nu_13 = nu.y();
    double nu_23 = nu.z();
    double nu_21 = nu_12 * E.y() / E.x();
    double nu_31 = nu_13 * E.z() / E.x();
    double nu_32 = nu_23 * E.z() / E.y();
    double k = 1.0 - nu_23 * nu_32 - nu_12 * nu_21 - nu_13 * nu_31 - nu_12 * nu_23 * nu_31 - nu_21 * nu_32 * nu_13;

    ChMatrixNM<double, 6, 6> D;
    D.setZero();
    D(0, 0) = E.x() * (1 - nu_23 * nu_32) / k;
    D(1, 0) = E.y() * (nu_13 * nu_32 + nu_12) / k;
    D(2, 0) = E.z() * (nu_12 * nu_23 + nu_13) / k;

    D(0, 1) = E.x() * (nu_23 * nu_31 + nu_21) / k;
    D(1, 1) = E.y() * (1 - nu_13 * nu_31) / k;
    D(2, 1) = E.z() * (nu_13 * nu_21 + nu_23) / k;

    D(0, 2) = E.x() * (nu_21 * nu_32 + nu_31) / k;
    D(1, 2) = E.y() * (nu_12 * nu_31 + nu_32) / k;
    D(2, 2) = E.z() * (1 - nu_12 * nu_21) / k;

    D(3, 3) = G.z();
    D(4, 4) = G.y();
    D(5, 5) = G.x();

    m_D = D;
}